

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O2

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
IndexManager::FindSuchKey
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          IndexManager *this,STMT *S,TableInfo *T)

{
  vector<condition,_std::allocator<condition>_> *this_00;
  reference pvVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  size_type __n;
  _Rb_tree_header *p_Var8;
  _Self __tmp;
  BpTree<int> *this_01;
  BpTree<float> *this_02;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_03;
  int local_314;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> temp1;
  int IndexColumn;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_2d8;
  condition C;
  string filename;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> temp2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  p_Var8 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var8->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var8->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = &temp1._M_t._M_impl.super__Rb_tree_header;
  temp1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  temp1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  temp1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  temp2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &temp2._M_t._M_impl.super__Rb_tree_header._M_header;
  temp2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  temp2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  filename.field_2._M_local_buf[0] = '\0';
  temp2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __n = 0;
  local_314 = 0;
  temp1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
  temp1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
  temp2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       temp2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    this_00 = S->c_list;
    if ((ulong)(((long)(this_00->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this_00->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= __n) {
      std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
      ~_Rb_tree(&temp2._M_t);
      std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
      ~_Rb_tree(&temp1._M_t);
      std::__cxx11::string::~string((string *)&filename);
      return __return_storage_ptr__;
    }
    pvVar1 = std::vector<condition,_std::allocator<condition>_>::at(this_00,__n);
    condition::condition(&C,pvVar1);
    if (C.isIndex != false) {
      std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
                (&temp2._M_t);
      std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
      operator=(&temp2._M_t,&__return_storage_ptr__->_M_t);
      std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
                (&__return_storage_ptr__->_M_t);
      std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
                (&temp1._M_t);
      IndexColumn = C.colunmID;
      iVar2 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(T->indexInfo)._M_t,&IndexColumn);
      std::operator+(&local_1b0,&this->Direction,&S->tableName);
      std::operator+(&local_190,&local_1b0,"_");
      std::operator+(&local_50,&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &iVar2._M_node[1]._M_parent);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8
                     ,&local_50,"_idx.dat");
      std::__cxx11::string::operator=((string *)&filename,(string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      if (C.type == 90000) {
        std::__cxx11::string::string((string *)&local_90,(string *)&filename);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>_>
                ::find(&(this->BpTrees_F)._M_t,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        if ((uint)C.op < 6) {
          this_02 = (BpTree<float> *)(iVar4._M_node + 2);
          switch(C.op) {
          case 0:
            BpTree<float>::FindEQ
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_02,
                       C.key.floatV);
            break;
          case 1:
            BpTree<float>::FindGreater
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_02,
                       C.key.floatV,true);
            break;
          case 2:
            BpTree<float>::FindGreater
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_02,
                       C.key.floatV,false);
            break;
          case 3:
            BpTree<float>::FindLess
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_02,
                       C.key.floatV,true);
            break;
          case 4:
            BpTree<float>::FindLess
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_02,
                       C.key.floatV,false);
            break;
          case 5:
            BpTree<float>::FindNEQ
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_02,
                       C.key.floatV);
          }
LAB_00127827:
          std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
          operator=(&temp1._M_t,&local_2d8);
          std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
          ~_Rb_tree(&local_2d8);
        }
      }
      else if (C.type == 50000) {
        std::__cxx11::string::string((string *)&local_70,(string *)&filename);
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>_>
                ::find(&(this->BpTrees_I)._M_t,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if ((uint)C.op < 6) {
          this_01 = (BpTree<int> *)(iVar3._M_node + 2);
          switch(C.op) {
          case 0:
            BpTree<int>::FindEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,
                                this_01,C.key.intV);
            break;
          case 1:
            BpTree<int>::FindGreater
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_01,
                       C.key.intV,true);
            break;
          case 2:
            BpTree<int>::FindGreater
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_01,
                       C.key.intV,false);
            break;
          case 3:
            BpTree<int>::FindLess
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_01,
                       C.key.intV,true);
            break;
          case 4:
            BpTree<int>::FindLess
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_01,
                       C.key.intV,false);
            break;
          case 5:
            BpTree<int>::FindNEQ
                      ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_01,
                       C.key.intV);
          }
          goto LAB_00127827;
        }
      }
      else if (120000 < C.type) {
        std::__cxx11::string::string((string *)&local_b0,(string *)&filename);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::find(&(this->BpTrees_S)._M_t,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        if ((uint)C.op < 6) {
          this_03 = (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(iVar5._M_node + 2);
          switch(C.op) {
          case 0:
            k = &local_d0;
            std::__cxx11::string::string((string *)k,(string *)&C.key.charV);
            BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::FindEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_03,k);
            break;
          case 1:
            k = &local_f0;
            std::__cxx11::string::string((string *)k,(string *)&C.key.charV);
            BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::FindGreater((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_03,k,
                          true);
            break;
          case 2:
            k = &local_110;
            std::__cxx11::string::string((string *)k,(string *)&C.key.charV);
            BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::FindGreater((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_03,k,
                          false);
            break;
          case 3:
            k = &local_130;
            std::__cxx11::string::string((string *)k,(string *)&C.key.charV);
            BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_03,k,
                       true);
            break;
          case 4:
            k = &local_150;
            std::__cxx11::string::string((string *)k,(string *)&C.key.charV);
            BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_03,k,
                       false);
            break;
          case 5:
            k = &local_170;
            std::__cxx11::string::string((string *)k,(string *)&C.key.charV);
            BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::FindNEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_2d8,this_03,k);
          }
          std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
          operator=(&temp1._M_t,&local_2d8);
          std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
          ~_Rb_tree(&local_2d8);
          std::__cxx11::string::~string((string *)k);
        }
      }
      p_Var7 = temp1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_314 == 0) {
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        operator=(&__return_storage_ptr__->_M_t,&temp1._M_t);
      }
      else {
        for (; (_Rb_tree_header *)p_Var7 != p_Var8;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          iVar6 = std::
                  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
                  ::find(&temp2._M_t,(key_type *)(p_Var7 + 1));
          if ((_Rb_tree_header *)iVar6._M_node != &temp2._M_t._M_impl.super__Rb_tree_header) {
            std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
            _M_insert_unique<Addr_const&>
                      ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                        *)__return_storage_ptr__,(Addr *)(p_Var7 + 1));
          }
        }
      }
      local_314 = local_314 + 1;
    }
    condition::~condition(&C);
    __n = __n + 1;
  } while( true );
}

Assistant:

set<Addr> IndexManager::FindSuchKey(STMT S, TableInfo T) {
    string filename;
    int i, count = 0;
    set<Addr> ans, temp1, temp2;
    for (i = 0; i < S.c_list->size(); i++) {
        condition C = S.c_list->at(i);
        if (!C.isIndex)
            continue;						//如果不是index的约束条件，略过
        //将当前结果传给temp2作为中间变量
        temp2.clear();
        temp2 = ans;
        ans.clear();
        temp1.clear();
        int IndexColumn = C.colunmID;
        map<int, string>::iterator temp = T.indexInfo.find(IndexColumn);
        filename = Direction + S.tableName + "_" + temp->second + "_idx.dat";
        if (C.type == 50000) {
            BpTree<int>& Tree = FindBpTree_I(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.intV);			break;
                case 1: temp1 = Tree.FindGreater(C.key.intV, true); break;
                case 2: temp1 = Tree.FindGreater(C.key.intV, false);break;
                case 3: temp1 = Tree.FindLess(C.key.intV, true);	break;
                case 4: temp1 = Tree.FindLess(C.key.intV, false);	break;
                case 5: temp1 = Tree.FindNEQ(C.key.intV);			break;
                default:break;
            }
        }
        else if (C.type == 90000) {
            BpTree<float>& Tree = FindBpTree_F(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.floatV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.floatV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.floatV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.floatV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.floatV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.floatV);				break;
                default:break;
            }
        }
        else if (C.type > 120000) {
            BpTree<string>& Tree = FindBpTree_S(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.charV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.charV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.charV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.charV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.charV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.charV);				break;
                default:
                    break;
            }
        }
        if (count == 0) {
            ans = temp1;				//如果是第一个条件，那么得到的结果无需跟temp2取交集
        }
        else {
            set<Addr>::iterator it;		//如果不是第一个条件，得到的结果需要跟之前的结果temp2取交集
            it = temp1.begin();
            while (it != temp1.end()) {
                if (temp2.find(*it) != temp2.end())
                    ans.insert(*it);
                it++;
            }
        }
        count++;						//对索引条件计数
    }
    return ans;
}